

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageBase.cpp
# Opt level: O1

vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_> * __thiscall
myvk::ImageBase::GetDstMemoryBarriers
          (vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>
           *__return_storage_ptr__,ImageBase *this,
          vector<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_> *regions,
          VkAccessFlags src_access_mask,VkAccessFlags dst_access_mask,VkImageLayout old_layout,
          VkImageLayout new_layout,uint32_t src_queue_family,uint32_t dst_queue_family)

{
  pointer pVVar1;
  VkImage pVVar2;
  uint32_t uVar3;
  uint32_t *puVar4;
  long lVar5;
  ulong uVar6;
  uint32_t *puVar7;
  uint uVar8;
  ulong uVar9;
  allocator_type local_39;
  ImageBase *local_38;
  
  local_38 = this;
  std::vector<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>::vector
            (__return_storage_ptr__,
             ((long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(regions->
                    super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,&local_39);
  pVVar1 = (regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(regions->super__Vector_base<VkBufferImageCopy,_std::allocator<VkBufferImageCopy>_>)
                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1;
  if (lVar5 != 0) {
    uVar6 = (lVar5 >> 3) * 0x6db6db6db6db6db7;
    pVVar2 = local_38->m_image;
    puVar7 = &(((__return_storage_ptr__->
                super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>).
                _M_impl.super__Vector_impl_data._M_start)->subresourceRange).baseArrayLayer;
    puVar4 = &(pVVar1->imageSubresource).baseArrayLayer;
    uVar8 = 1;
    do {
      puVar7[-0xf] = 0x2d;
      *(VkImage *)(puVar7 + -5) = pVVar2;
      puVar7[-9] = old_layout;
      puVar7[-8] = new_layout;
      puVar7[-0xb] = src_access_mask;
      puVar7[-10] = dst_access_mask;
      puVar7[-7] = src_queue_family;
      puVar7[-6] = dst_queue_family;
      uVar3 = ((VkImageSubresourceLayers *)(puVar4 + -2))->mipLevel;
      ((VkImageSubresourceRange *)(puVar7 + -3))->aspectMask =
           ((VkImageSubresourceLayers *)(puVar4 + -2))->aspectMask;
      ((VkImageSubresourceRange *)(puVar7 + -3))->baseMipLevel = uVar3;
      puVar7[-1] = 1;
      *(undefined8 *)puVar7 = *(undefined8 *)puVar4;
      uVar9 = (ulong)uVar8;
      puVar7 = puVar7 + 0x12;
      puVar4 = puVar4 + 0xe;
      uVar8 = uVar8 + 1;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkImageMemoryBarrier>
ImageBase::GetDstMemoryBarriers(const std::vector<VkBufferImageCopy> &regions, VkAccessFlags src_access_mask,
                                VkAccessFlags dst_access_mask, VkImageLayout old_layout, VkImageLayout new_layout,
                                uint32_t src_queue_family, uint32_t dst_queue_family) const {
	std::vector<VkImageMemoryBarrier> barriers(regions.size());

	for (uint32_t i = 0; i < regions.size(); ++i) {
		VkImageMemoryBarrier &cur = barriers[i];
		cur.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
		cur.image = m_image;
		cur.oldLayout = old_layout;
		cur.newLayout = new_layout;
		cur.srcAccessMask = src_access_mask;
		cur.dstAccessMask = dst_access_mask;
		cur.srcQueueFamilyIndex = src_queue_family;
		cur.dstQueueFamilyIndex = dst_queue_family;
		VkImageSubresourceRange &range = cur.subresourceRange;
		range.aspectMask = regions[i].imageSubresource.aspectMask;
		range.baseMipLevel = regions[i].imageSubresource.mipLevel;
		range.levelCount = 1;
		range.baseArrayLayer = regions[i].imageSubresource.baseArrayLayer;
		range.layerCount = regions[i].imageSubresource.layerCount;
	}
	return barriers;
}